

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O1

void __thiscall QEvdevTabletData::report(QEvdevTabletData *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  long in_FS_OFFSET;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_68;
  double dStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  qreal local_48;
  qreal qStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->state).lastReportTool == 0) && (iVar11 = (this->state).tool, iVar11 != 0)) {
    QWindowSystemInterface::handleTabletEnterProximityEvent(0x10,iVar11,(long)this->q->m_fd);
  }
  uVar1 = (this->state).x;
  uVar4 = (this->state).y;
  uVar2 = (this->minValues).x;
  uVar5 = (this->minValues).y;
  auVar14._0_8_ = (double)(int)(uVar1 - uVar2);
  auVar14._8_8_ = (double)(int)(uVar4 - uVar5);
  uVar3 = (this->maxValues).x;
  uVar6 = (this->maxValues).y;
  auVar13._0_8_ = (double)(int)(uVar3 - uVar2);
  auVar13._8_8_ = (double)(int)(uVar6 - uVar5);
  auVar13 = divpd(auVar14,auVar13);
  QGuiApplication::primaryScreen();
  auVar14 = QScreen::geometry();
  local_68 = auVar13._0_8_;
  dStack_60 = auVar13._8_8_;
  local_48 = (double)((auVar14._8_4_ - auVar14._0_4_) + 1) * local_68;
  qStack_40 = (double)((auVar14._12_4_ - auVar14._4_4_) + 1) * dStack_60;
  iVar11 = (this->state).tool;
  bVar7 = (this->state).down;
  if ((bVar7 == false) && ((this->state).lastReportDown == true)) {
    local_48 = (this->state).lastReportPos.xp;
    qStack_40 = (this->state).lastReportPos.yp;
    iVar11 = (this->state).lastReportTool;
  }
  iVar8 = (this->minValues).p;
  iVar9 = (this->maxValues).p - iVar8;
  if (iVar9 == 0) {
    dVar12 = 1.0;
  }
  else {
    dVar12 = (double)((this->state).p - iVar8) / (double)iVar9;
  }
  if ((bVar7 != false) || ((this->state).lastReportDown == true)) {
    local_58 = 0;
    uStack_50 = 0;
    iVar8 = this->q->m_fd;
    uVar10 = QGuiApplication::keyboardModifiers();
    QWindowSystemInterface::handleTabletEvent
              (dVar12,0,0,0,0,0,&local_58,&local_48,0x10,iVar11,bVar7,0,(long)iVar8,uVar10);
  }
  if (((this->state).lastReportTool != 0) && ((this->state).tool == 0)) {
    QWindowSystemInterface::handleTabletLeaveProximityEvent(0x10,0,(long)this->q->m_fd);
  }
  (this->state).lastReportDown = (this->state).down;
  (this->state).lastReportTool = (this->state).tool;
  (this->state).lastReportPos.xp = local_48;
  (this->state).lastReportPos.yp = qStack_40;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTabletData::report()
{
    if (!state.lastReportTool && state.tool)
        QWindowSystemInterface::handleTabletEnterProximityEvent(int(QInputDevice::DeviceType::Stylus), state.tool, q->deviceId());

    qreal nx = (state.x - minValues.x) / qreal(maxValues.x - minValues.x);
    qreal ny = (state.y - minValues.y) / qreal(maxValues.y - minValues.y);

    QRect winRect = QGuiApplication::primaryScreen()->geometry();
    QPointF globalPos(nx * winRect.width(), ny * winRect.height());
    int pointer = state.tool;
    // Prevent sending confusing values of 0 when moving the pen outside the active area.
    if (!state.down && state.lastReportDown) {
        globalPos = state.lastReportPos;
        pointer = state.lastReportTool;
    }

    int pressureRange = maxValues.p - minValues.p;
    qreal pressure = pressureRange ? (state.p - minValues.p) / qreal(pressureRange) : qreal(1);

    if (state.down || state.lastReportDown) {
        QWindowSystemInterface::handleTabletEvent(0, QPointF(), globalPos,
                                                  int(QInputDevice::DeviceType::Stylus), pointer,
                                                  state.down ? Qt::LeftButton : Qt::NoButton,
                                                  pressure, 0, 0, 0, 0, 0, q->deviceId(),
                                                  qGuiApp->keyboardModifiers());
    }

    if (state.lastReportTool && !state.tool)
        QWindowSystemInterface::handleTabletLeaveProximityEvent(int(QInputDevice::DeviceType::Stylus), state.tool, q->deviceId());

    state.lastReportDown = state.down;
    state.lastReportTool = state.tool;
    state.lastReportPos = globalPos;
}